

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  uint *puVar1;
  pointer pcVar2;
  int iVar3;
  LogMessage *other;
  string *psVar4;
  string *psVar5;
  long lVar6;
  int iVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar3 = this->extensions_offset_;
    if (iVar3 == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
      iVar3 = this->extensions_offset_;
    }
    psVar4 = ExtensionSet::MutableString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar3),
                        *(int *)(field + 0x28),(FieldType)field[0x2c],field);
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  else {
    lVar6 = ((long)field - *(long *)(*(long *)(field + 0x38) + 0x30) >> 3) * -0x1111111111111111;
    iVar3 = (int)lVar6;
    iVar7 = iVar3 + 0x1f;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (long)(iVar7 >> 5) * 4 + (long)this->has_bits_offset_);
    *puVar1 = *puVar1 | 1 << ((byte)lVar6 & 0x1f);
    lVar6 = (long)this->offsets_[iVar3];
    psVar5 = *(string **)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar6);
    if (psVar5 != *(string **)
                   ((long)&(this->default_instance_->super_MessageLite)._vptr_MessageLite + lVar6))
    {
      std::__cxx11::string::_M_assign(psVar5);
      return;
    }
    psVar5 = (string *)operator_new(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    pcVar2 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>(psVar5,pcVar2,pcVar2 + value->_M_string_length);
    *(string **)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar6) = psVar5;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SetString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        string** ptr = MutableField<string*>(message, field);
        if (*ptr == DefaultRaw<const string*>(field)) {
          *ptr = new string(value);
        } else {
          (*ptr)->assign(value);
        }
        break;
      }
    }
  }
}